

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O2

void Nwk_ManDfs_rec(Nwk_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  long lVar2;
  
  iVar1 = pObj->pMan->nTravIds;
  if (pObj->TravId == iVar1) {
    return;
  }
  pObj->TravId = iVar1;
  for (lVar2 = 0; (lVar2 < pObj->nFanins && (pObj->pFanio[lVar2] != (Nwk_Obj_t *)0x0));
      lVar2 = lVar2 + 1) {
    Nwk_ManDfs_rec(pObj->pFanio[lVar2],vNodes);
  }
  Vec_PtrPush(vNodes,pObj);
  return;
}

Assistant:

void Nwk_ManDfs_rec( Nwk_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return;
    Nwk_ObjSetTravIdCurrent( pObj );
    Nwk_ObjForEachFanin( pObj, pNext, i )
        Nwk_ManDfs_rec( pNext, vNodes );
    Vec_PtrPush( vNodes, pObj );
}